

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O0

int x25519_set_priv_raw(EVP_PKEY *pkey,uint8_t *in,size_t len)

{
  uint8_t *out_public_value;
  X25519_KEY *key;
  size_t len_local;
  uint8_t *in_local;
  EVP_PKEY *pkey_local;
  
  if (len == 0x20) {
    out_public_value = (uint8_t *)OPENSSL_malloc(0x41);
    if (out_public_value == (uint8_t *)0x0) {
      pkey_local._4_4_ = 0;
    }
    else {
      OPENSSL_memcpy(out_public_value + 0x20,in,0x20);
      X25519_public_from_private(out_public_value,out_public_value + 0x20);
      out_public_value[0x40] = '\x01';
      x25519_free(pkey);
      pkey->pkey = out_public_value;
      pkey_local._4_4_ = 1;
    }
  }
  else {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                  ,0x21);
    pkey_local._4_4_ = 0;
  }
  return pkey_local._4_4_;
}

Assistant:

static int x25519_set_priv_raw(EVP_PKEY *pkey, const uint8_t *in, size_t len) {
  if (len != 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  X25519_KEY *key =
      reinterpret_cast<X25519_KEY *>(OPENSSL_malloc(sizeof(X25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  OPENSSL_memcpy(key->priv, in, 32);
  X25519_public_from_private(key->pub, key->priv);
  key->has_private = 1;

  x25519_free(pkey);
  pkey->pkey = key;
  return 1;
}